

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,int *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  string_t substring;
  string_t substring_00;
  string_t substring_01;
  string_t input;
  string_t input_00;
  string_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar7 = 0;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      substring_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar7 * 4 + 8);
      substring_01.value._0_8_ = *(undefined8 *)((long)&ldata->value + lVar7 * 4);
      input_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + lVar7 * 4 + 8);
      input_01.value._0_8_ = *(undefined8 *)((long)&rdata->value + lVar7 * 4);
      iVar2 = BitPositionOperator::Operation<duckdb::string_t,duckdb::string_t,int>
                        (substring_01,input_01);
      *(int *)((long)result_data + lVar7) = iVar2;
      lVar7 = lVar7 + 4;
    }
  }
  else {
    uVar8 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_01c68def:
        uVar5 = uVar8 << 4 | 8;
        for (; uVar3 = uVar8, uVar8 < uVar9; uVar8 = uVar8 + 1) {
          substring.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar5);
          substring.value._0_8_ = *(undefined8 *)((long)ldata + (uVar5 - 8));
          input.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar5);
          input.value._0_8_ = *(undefined8 *)((long)rdata + (uVar5 - 8));
          iVar2 = BitPositionOperator::Operation<duckdb::string_t,duckdb::string_t,int>
                            (substring,input);
          result_data[uVar8] = iVar2;
          uVar5 = uVar5 + 0x10;
        }
      }
      else {
        uVar5 = puVar1[uVar4];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_01c68def;
        uVar3 = uVar9;
        if (uVar5 != 0) {
          uVar10 = uVar8 << 4 | 8;
          for (uVar6 = 0; uVar3 = uVar6 + uVar8, uVar6 + uVar8 < uVar9; uVar6 = uVar6 + 1) {
            if ((uVar5 >> (uVar6 & 0x3f) & 1) != 0) {
              substring_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar10)
              ;
              substring_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar10 - 8));
              input_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar10);
              input_00.value._0_8_ = *(undefined8 *)((long)rdata + (uVar10 - 8));
              iVar2 = BitPositionOperator::Operation<duckdb::string_t,duckdb::string_t,int>
                                (substring_00,input_00);
              result_data[uVar8 + uVar6] = iVar2;
            }
            uVar10 = uVar10 + 0x10;
          }
        }
      }
      uVar8 = uVar3;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}